

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

void help(char **argv)

{
  puts("Benchmark EC multiplication algorithms");
  putchar(10);
  printf("Usage: %s <help|pippenger_wnaf|strauss_wnaf|simple>\n",*argv);
  puts("The output shows the number of multiplied and summed points right after the");
  puts("function name. The letter \'g\' indicates that one of the points is the generator.");
  puts("The benchmarks are divided by the number of points.");
  putchar(10);
  puts("default (ecmult_multi): picks pippenger_wnaf or strauss_wnaf depending on the");
  puts("                        batch size");
  puts("pippenger_wnaf:         for all batch sizes");
  puts("strauss_wnaf:           for all batch sizes");
  puts("simple:                 multiply and sum each point individually");
  return;
}

Assistant:

static void help(char **argv) {
    printf("Benchmark EC multiplication algorithms\n");
    printf("\n");
    printf("Usage: %s <help|pippenger_wnaf|strauss_wnaf|simple>\n", argv[0]);
    printf("The output shows the number of multiplied and summed points right after the\n");
    printf("function name. The letter 'g' indicates that one of the points is the generator.\n");
    printf("The benchmarks are divided by the number of points.\n");
    printf("\n");
    printf("default (ecmult_multi): picks pippenger_wnaf or strauss_wnaf depending on the\n");
    printf("                        batch size\n");
    printf("pippenger_wnaf:         for all batch sizes\n");
    printf("strauss_wnaf:           for all batch sizes\n");
    printf("simple:                 multiply and sum each point individually\n");
}